

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O0

void __thiscall dynamicgraph::OutStringStream::OutStringStream(OutStringStream *this)

{
  OutStringStream *this_local;
  
  std::ios::ios((ios *)&(this->super_ostringstream).
                        super_basic_ostream<char,_std::char_traits<char>_>.field_0xb0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  (this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
       = (_func_int **)0x13afb8;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xb0 =
       0x13afe0;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x70 = 0;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x78 = 0;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x80 = 0;
  (this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x88 = 0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x90);
  return;
}

Assistant:

OutStringStream::OutStringStream()
    : std::ostringstream(), buffer(0), index(0), bufferSize(0), full(false) {
  dgDEBUGINOUT(15);
}